

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O2

void value_free(value_t *value)

{
  if (value->type == 0x6d) {
    free((value->val).m.data);
    (value->val).d = 0.0;
    (value->val).m.data = (uchar *)0x0;
  }
  else if (value->type == 0x7a) {
    free((value->val).z);
    (value->val).d = 0.0;
  }
  value->type = 0;
  return;
}

Assistant:

void
value_free(
    value_t* value)
{
    if (value->type == 'z') {
        free(value->val.z);
        value->val.z = NULL;
    } else if (value->type == 'm') {
        free(value->val.m.data);
        value->val.m.data = NULL;
        value->val.m.length = 0;
    }
    value->type = 0;
}